

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  UnitTestImpl *this_00;
  long in_FS_OFFSET;
  string *value_local;
  string *key_local;
  UnitTest *this_local;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->impl_;
  TestProperty::TestProperty((TestProperty *)&this_local,key,value);
  internal::UnitTestImpl::RecordProperty(this_00,(TestProperty *)&this_local);
  TestProperty::~TestProperty((TestProperty *)&this_local);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}